

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O0

void __thiscall GlobalSimpleStringCache::GlobalSimpleStringCache(GlobalSimpleStringCache *this)

{
  SimpleStringCacheAllocator *this_00;
  TestMemoryAllocator *origAllocator;
  GlobalSimpleStringCache *this_local;
  
  SimpleStringInternalCache::SimpleStringInternalCache(&this->cache_);
  this_00 = (SimpleStringCacheAllocator *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
                         ,0xfb);
  origAllocator = SimpleString::getStringAllocator();
  SimpleStringCacheAllocator::SimpleStringCacheAllocator(this_00,&this->cache_,origAllocator);
  this->allocator_ = this_00;
  SimpleString::setStringAllocator(&this->allocator_->super_TestMemoryAllocator);
  return;
}

Assistant:

GlobalSimpleStringCache::GlobalSimpleStringCache()
{
    allocator_ = new SimpleStringCacheAllocator(cache_, SimpleString::getStringAllocator());
    SimpleString::setStringAllocator(allocator_);
}